

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

SP __thiscall pbrt::QuadMesh::makeFrom(QuadMesh *this,SP *tris)

{
  ulong uVar1;
  element_type *peVar2;
  pointer pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QuadMesh *pQVar6;
  ulong uVar7;
  SP SVar8;
  SP out;
  vec4i local_58;
  QuadMesh *local_48;
  __shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_48 = this;
  std::make_shared<pbrt::QuadMesh,std::shared_ptr<pbrt::Material>&>
            ((shared_ptr<pbrt::Material> *)&out);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::operator=(&((out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_Shape).textures._M_t,
              &(((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->super_Shape).textures._M_t);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            (&(out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vertex,
             &((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              vertex);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            (&(out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->normal,
             &((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              normal);
  uVar7 = 0;
  do {
    _Var4._M_pi = out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar2 = (tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pvVar3 = (peVar2->index).
             super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = ((long)(peVar2->index).
                   super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)pvVar3) / 0xc;
    if (uVar5 <= uVar7) {
      if (((long)(peVar2->vertex).
                 super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(peVar2->vertex).
                super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                super__Vector_impl_data._M_start) / 0xc == uVar5 * 3) {
        std::__shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,&out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>);
        pQVar6 = local_48;
        remeshVertices((pbrt *)local_48,(SP *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
      else {
        out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (local_48->super_Shape).super_Entity._vptr_Entity =
             (_func_int **)out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        (local_48->super_Shape).super_Entity.super_enable_shared_from_this<pbrt::Entity>.
        _M_weak_this.super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)_Var4._M_pi;
        out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        pQVar6 = local_48;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      SVar8.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar8.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pQVar6;
      return (SP)SVar8.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>;
    }
    local_58.x = pvVar3[uVar7].x;
    uVar1 = uVar7 + 1;
    local_58.z = (int)((ulong)*(undefined8 *)((long)(pvVar3 + uVar7) + 4) >> 0x20);
    local_58.y = (int)*(undefined8 *)((long)(pvVar3 + uVar7) + 4);
    if (uVar1 < uVar5) {
      local_58.w = *(int *)((long)(pvVar3 + uVar1) + 4);
      if ((pvVar3[uVar1].x == local_58.x) && (local_58.w == local_58.z)) {
        local_58.w = *(int *)((long)(pvVar3 + uVar1) + 8);
        std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
        emplace_back<pbrt::math::vec4i>
                  (&(out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    index,&local_58);
        uVar7 = uVar1;
      }
      else {
        if ((pvVar3[uVar1].x != local_58.z) || (*(int *)((long)(pvVar3 + uVar1) + 8) != local_58.x))
        goto LAB_0010f32d;
        std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
        emplace_back<pbrt::math::vec4i>
                  (&(out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    index,&local_58);
        uVar7 = uVar1;
      }
    }
    else {
LAB_0010f32d:
      local_58.w = local_58.z;
      std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
      emplace_back<pbrt::math::vec4i>
                (&(out.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->index
                 ,&local_58);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

QuadMesh::SP QuadMesh::makeFrom(TriangleMesh::SP tris)
  {
    QuadMesh::SP out = std::make_shared<QuadMesh>(tris->material);
    out->textures = tris->textures;
    // out->texcoord = in->texcoord;
    out->vertex   = tris->vertex;
    out->normal   = tris->normal;
      
    for (size_t i=0;i<tris->index.size();i++) {
      vec3i idx0 = tris->index[i+0];
      if ((i+1) < tris->index.size()) {
        vec3i idx1 = tris->index[i+1];
        if (idx1.x == idx0.x && idx1.y == idx0.z) {
          // could merge!!!
          out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx1.z));
          ++i;
          continue;
        }
        if (idx1.x == idx0.z && idx1.z == idx0.x) {
          // could merge!!!
          out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx1.y));
          ++i;
          continue;
        }
      }
      // could not merge :-( - emit tri as degenerate quad
      out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx0.z));
    }
      
    if (tris->vertex.size() == 3*tris->index.size()) {
      return remeshVertices(out);
    }
    else
      return out;
  }